

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

bool Unicode::append(uint32 ch,String *str)

{
  byte c;
  String *str_local;
  uint32 ch_local;
  
  c = (byte)ch;
  if ((ch & 0xffffff80) == 0) {
    String::append(str,c);
    str_local._7_1_ = true;
  }
  else if ((ch & 0xfffff800) == 0) {
    String::append(str,(byte)(ch >> 6) | 0xc0);
    String::append(str,c & 0x3f | 0x80);
    str_local._7_1_ = true;
  }
  else if ((ch & 0xffff0000) == 0) {
    String::append(str,(byte)(ch >> 0xc) | 0xe0);
    String::append(str,(byte)(ch >> 6) & 0x3f | 0x80);
    String::append(str,c & 0x3f | 0x80);
    str_local._7_1_ = true;
  }
  else if (ch < 0x110000) {
    String::append(str,(byte)(ch >> 0x12) | 0xf0);
    String::append(str,(byte)(ch >> 0xc) & 0x3f | 0x80);
    String::append(str,(byte)(ch >> 6) & 0x3f | 0x80);
    String::append(str,c & 0x3f | 0x80);
    str_local._7_1_ = true;
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

static bool append(uint32 ch, String& str)
  {
#ifdef _UNICODE
    if((ch & ~(0x10000UL - 1)) == 0) // ch < 0x10000
    {
      if((ch & 0xF800ULL) != 0xD800ULL) // ch < 0xD800 || ch > 0xDFFF
      {
        str.append((tchar)ch);
        return true;
      }
      return false;
    }
    if(ch < 0x110000UL)
    {
      ch -= 0x10000UL;
      str.append((tchar)((ch >> 10) | 0xD800UL));
      str.append((ch & 0x3ffULL) | 0xDC00UL);
      return true;
    }
#else
    if((ch & ~(0x80UL - 1)) == 0) // ch < 0x80
    {
      str.append((char)ch);
      return true;
    }
    if((ch & ~(0x800UL - 1)) == 0) // ch < 0x800
    {
      str.append((ch >> 6) | 0xC0);
      str.append((ch & 0x3F) | 0x80);
      return true;
    }
    if((ch & ~(0x10000UL - 1)) == 0) // ch < 0x10000
    {
      str.append((ch >> 12) | 0xE0);
      str.append(((ch >> 6) & 0x3F) | 0x80);
      str.append((ch & 0x3F) | 0x80);
      return true;
    }
    if(ch < 0x110000UL)
    {
      str.append((ch >> 18) | 0xF0);
      str.append(((ch >> 12) & 0x3F) | 0x80);
      str.append(((ch >> 6) & 0x3F) | 0x80);
      str.append((ch & 0x3F) | 0x80);
      return true;
    }
#endif
    return false;
  }